

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.c
# Opt level: O0

int16_t OPL3_EnvelopeCalcSin7(uint16_t phase,uint16_t envelope)

{
  ushort uVar1;
  undefined2 local_10;
  undefined2 local_a;
  uint16_t neg;
  uint16_t out;
  uint16_t envelope_local;
  uint16_t phase_local;
  
  local_10 = 0;
  local_a = phase & 0x3ff;
  if ((phase & 0x200) != 0) {
    local_10 = 0xffff;
    local_a = phase & 0x1ff ^ 0x1ff;
  }
  uVar1 = OPL3_EnvelopeCalcExp((uint)(ushort)(local_a << 3) + (uint)envelope * 8);
  return uVar1 ^ local_10;
}

Assistant:

static int16_t OPL3_EnvelopeCalcSin7(uint16_t phase, uint16_t envelope)
{
    uint16_t out = 0;
    uint16_t neg = 0;
    phase &= 0x3ff;
    if (phase & 0x200)
    {
        neg = 0xffff;
        phase = (phase & 0x1ff) ^ 0x1ff;
    }
    out = phase << 3;
    return OPL3_EnvelopeCalcExp(out + (envelope << 3)) ^ neg;
}